

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial_test.hpp
# Opt level: O2

Polynomial<openjij::graph::Index,_double> * GeneratePolynomialInteractionsSparseInt2<double>(void)

{
  long lVar1;
  Polynomial<openjij::graph::Index,_double> *in_RDI;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<unsigned_long> __l_03;
  initializer_list<unsigned_long> __l_04;
  initializer_list<unsigned_long> __l_05;
  allocator_type local_25b;
  allocator_type local_25a;
  allocator_type local_259;
  allocator_type local_258;
  allocator_type local_257;
  allocator_type local_256;
  allocator_type local_255;
  int local_254;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_250;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_238;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_220;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_208;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_1f0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_1d8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_1c0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_1a8;
  unsigned_long local_190 [9];
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  undefined8 local_130;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_128;
  undefined8 local_110;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_108;
  undefined8 local_f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  undefined8 local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  undefined8 local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  undefined8 local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  undefined8 local_70;
  pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double> local_68;
  unsigned_long local_48 [4];
  
  local_1a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_148,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1a8);
  local_130 = 0;
  local_190[2] = 0;
  __l._M_len = 1;
  __l._M_array = local_190 + 2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1c0,__l,&local_255);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_128,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1c0);
  local_110 = 0x8000000000000000;
  local_190[1] = 1;
  __l_00._M_len = 1;
  __l_00._M_array = local_190 + 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1d8,__l_00,&local_256);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_108,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1d8);
  local_f0 = 0;
  local_190[0] = 2;
  __l_01._M_len = 1;
  __l_01._M_array = local_190;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1f0,__l_01,&local_257);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_e8,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1f0);
  local_d0 = 0xc000000000000000;
  local_190[7] = 0;
  local_190[8] = 1;
  __l_02._M_len = 2;
  __l_02._M_array = local_190 + 7;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_208,__l_02,&local_258);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_c8,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_208);
  local_b0 = 0x4024000000000000;
  local_190[5] = 0;
  local_190[6] = 2;
  __l_03._M_len = 2;
  __l_03._M_array = local_190 + 5;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_220,__l_03,&local_259);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_a8,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_220);
  local_90 = 0x8000000000000000;
  local_190[3] = 1;
  local_190[4] = 2;
  __l_04._M_len = 2;
  __l_04._M_array = local_190 + 3;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_238,__l_04,&local_25a);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_88,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_238);
  local_70 = 0x4035000000000000;
  local_48[0] = 0;
  local_48[1] = 1;
  local_48[2] = 2;
  __l_05._M_len = 3;
  __l_05._M_array = local_48;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_250,__l_05,&local_25b);
  local_254 = -0x78;
  std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>::
  pair<int,_true>(&local_68,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_250,
                  &local_254);
  std::
  _Hashtable<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>const,double>,std::allocator<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>const,double>>,std::__detail::_Select1st,std::equal_to<std::vector<unsigned_long,std::allocator<unsigned_long>>>,cimod::vector_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _Hashtable<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>const,double>const*>
            ();
  lVar1 = 0xe0;
  do {
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&local_148._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_250);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_220);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_208);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_1f0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_1d8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_1c0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_1a8);
  return in_RDI;
}

Assistant:

cimod::Polynomial<openjij::graph::Index, FloatType> GeneratePolynomialInteractionsSparseInt2() {
   return cimod::Polynomial<openjij::graph::Index, FloatType> {
      {{}, +0.0},
      {{0}, -0.0}, {{1}, +0.0}, {{2}, -2.0},
      {{0, 1}, +10.0}, {{0, 2}, -0.0}, {{1, 2}, +21.0},
      {{0, 1, 2}, -120}
   };
}